

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddQuadFilled(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col)

{
  ImVec2 *in_RDI;
  uint in_R9D;
  undefined4 in_stack_ffffffffffffffd0;
  
  if ((in_R9D & 0xff000000) != 0) {
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI);
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI);
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI);
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI);
    PathFillConvex((ImDrawList *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                   (ImU32)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void ImDrawList::AddQuadFilled(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathFillConvex(col);
}